

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec_filter.hxx
# Opt level: O1

bool __thiscall
cryptox::basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::
filter(basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
       *this,char **src_begin,char *src_end,char **dest_begin,char *dest_end,bool must_flush)

{
  deque<char,_std::allocator<char>_> *d_first;
  char *first;
  char *pcVar1;
  _Map_pointer ppcVar2;
  _Map_pointer ppcVar3;
  _Elt_pointer pcVar4;
  char *pcVar5;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  *this_00;
  _Elt_pointer pcVar6;
  ulong uVar7;
  unsigned_long __n2;
  char *pcVar8;
  bool bVar9;
  _Deque_iterator<char,_char_&,_char_*> local_90;
  _Deque_iterator<char,_char_&,_char_*> local_70;
  iterator local_50;
  
  first = *src_begin;
  pcVar1 = *dest_begin;
  d_first = &this->_output;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  ::update<char_const*,std::back_insert_iterator<std::deque<char,std::allocator<char>>>>
            ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
              *)(this->_endec)._M_ptr,first,src_end,
             (back_insert_iterator<std::deque<char,_std::allocator<char>_>_>)d_first);
  this->_total_input = (size_t)(src_end + (this->_total_input - (long)*src_begin));
  *src_begin = src_end;
  ppcVar2 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  ppcVar3 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  pcVar6 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  pcVar4 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  pcVar5 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_start._M_last;
  pcVar8 = pcVar5 + (long)(pcVar6 + ((((((ulong)((long)ppcVar2 - (long)ppcVar3) >> 3) - 1) +
                                      (ulong)(ppcVar2 == (_Map_pointer)0x0)) * 0x200 -
                                     (long)(this->_output).
                                           super__Deque_base<char,_std::allocator<char>_>._M_impl.
                                           super__Deque_impl_data._M_finish._M_first) - (long)pcVar4
                                    ));
  if (dest_end + -(long)pcVar1 <=
      pcVar5 + (long)(pcVar6 + ((((((ulong)((long)ppcVar2 - (long)ppcVar3) >> 3) - 1) +
                                 (ulong)(ppcVar2 == (_Map_pointer)0x0)) * 0x200 -
                                (long)(this->_output).super__Deque_base<char,_std::allocator<char>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_first) -
                               (long)pcVar4))) {
    pcVar8 = dest_end + -(long)pcVar1;
  }
  if (pcVar6 != pcVar4) {
    if (pcVar8 != (char *)0x0) {
      local_70._M_first =
           (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_start._M_first;
      pcVar6 = pcVar4 + ((long)pcVar8 - (long)local_70._M_first);
      if (pcVar6 < (_Elt_pointer)0x200) {
        local_90._M_cur = pcVar4 + (long)pcVar8;
        local_90._M_first = local_70._M_first;
        local_90._M_node = ppcVar3;
        local_90._M_last = pcVar5;
      }
      else {
        uVar7 = (ulong)pcVar6 >> 9 | 0xff80000000000000;
        if (0 < (long)pcVar6) {
          uVar7 = (ulong)pcVar6 >> 9;
        }
        local_90._M_node = ppcVar3 + uVar7;
        local_90._M_first = *local_90._M_node;
        local_90._M_last = local_90._M_first + 0x200;
        local_90._M_cur = local_90._M_first + (long)(pcVar6 + uVar7 * -0x200);
      }
      local_70._M_cur = pcVar4;
      local_70._M_last = pcVar5;
      local_70._M_node = ppcVar3;
      std::__copy_move_dit<false,char,char&,char*,char*>(&local_70,&local_90,*dest_begin);
    }
    local_70._M_cur =
         (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_70._M_node =
         (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
         super__Deque_impl_data._M_start._M_node;
    pcVar6 = local_70._M_cur +
             ((long)pcVar8 -
             (long)(this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first);
    if (pcVar6 < (_Elt_pointer)0x200) {
      local_90._M_cur = local_70._M_cur + (long)pcVar8;
      local_90._M_node = local_70._M_node;
    }
    else {
      uVar7 = (ulong)pcVar6 >> 9 | 0xff80000000000000;
      if (0 < (long)pcVar6) {
        uVar7 = (ulong)pcVar6 >> 9;
      }
      local_90._M_node = local_70._M_node + uVar7;
      local_90._M_cur = *local_90._M_node + (long)(pcVar6 + uVar7 * -0x200);
    }
    local_70._M_first = *local_70._M_node;
    local_70._M_last = local_70._M_first + 0x200;
    local_90._M_first = *local_90._M_node;
    local_90._M_last = local_90._M_first + 0x200;
    std::deque<char,_std::allocator<char>_>::_M_erase(&local_50,d_first,&local_70,&local_90);
    *dest_begin = *dest_begin + (long)pcVar8;
    this->_total_output = (size_t)(pcVar8 + this->_total_output);
  }
  if (must_flush) {
    if ((this->_finalized == false) &&
       (this_00 = (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
                   *)(this->_endec)._M_ptr, *(long *)(this_00 + 0x10) != 0)) {
      evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
      ::finalize<std::back_insert_iterator<std::deque<char,std::allocator<char>>>>
                (this_00,(back_insert_iterator<std::deque<char,_std::allocator<char>_>_>)d_first);
    }
    this->_finalized = true;
    bVar9 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  }
  else {
    bVar9 = first == src_end;
  }
  return !bVar9;
}

Assistant:

bool filter(const char*& src_begin, const char* src_end, char*& dest_begin, char* dest_end, bool must_flush) {
			const size_t  input_size = std::distance( src_begin,  src_end);
			const size_t output_size = std::distance(dest_begin, dest_end);

			// Process Input...
			_endec->update(src_begin, src_end, std::back_inserter(_output));
			_total_input += std::distance(src_begin, src_end);
			src_begin = src_end;

			// Process Output...
			const size_t output_capacity = std::min BOOST_PREVENT_MACRO_SUBSTITUTION(
				output_size,
				_output.size()
			);

			if (!_output.empty()) {
				std::copy_n(_output.begin(), output_capacity, dest_begin);
				_output.erase(_output.begin(), _output.begin() + output_capacity);
				dest_begin += output_capacity;
				_total_output += output_capacity;
			}

			if (must_flush) {
				finalize();
				return !_output.empty();
			}

			return input_size != 0;
		}